

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::setup
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this)

{
  ulong uVar1;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this_00;
  size_t sVar2;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this_01;
  long *in_RDI;
  value_type_conflict2 vVar3;
  size_t *v1;
  size_t *v0;
  size_t edge;
  vector<double,_std::allocator<double>_> *costs;
  Graph *graph;
  Solution *in_stack_ffffffffffffff48;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff50;
  Data *data;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff60;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *local_50;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> **local_48;
  size_t local_40;
  size_t *local_38;
  ulong local_30;
  unsigned_long *local_28;
  unsigned_long *local_20;
  
  ProblemGraph::graph(*(ProblemGraph **)*in_RDI);
  this_00 = (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)(*in_RDI + 0x20);
  local_20 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff48);
  local_28 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff48);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    sVar2 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
                      ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1b47b7);
    if (sVar2 <= uVar1) break;
    local_40 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                         (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,0x1b47e1);
    local_38 = &local_40;
    this_01 = (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)
              andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                        (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,0x1b480d);
    local_48 = &local_50;
    sVar2 = *local_38;
    local_50 = this_01;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)this_00,local_30);
    updateEdgeWeight(this_01,sVar2,(size_t)in_stack_ffffffffffffff60._M_current,
                     (value_type_conflict2)in_stack_ffffffffffffff58._M_current);
    local_30 = local_30 + 1;
  }
  data = (Data *)*in_RDI;
  getSolution(this_00);
  vVar3 = evaluate<lineage::Data>(data,in_stack_ffffffffffffff48);
  in_RDI[0x14] = (long)vVar3;
  Solution::~Solution((Solution *)0x1b48cf);
  return;
}

Assistant:

inline void setup()
    {
        const auto& graph = data_.problemGraph.graph();
        const auto& costs = data_.costs;
        std::iota(parents_.begin(), parents_.end(), 0);

        for (size_t edge = 0; edge < graph.numberOfEdges(); ++edge) {

            const auto& v0 = graph.vertexOfEdge(edge, 0);
            const auto& v1 = graph.vertexOfEdge(edge, 1);

            updateEdgeWeight(v0, v1, costs[edge]);
        }
        objective_ = evaluate(data_, getSolution());
    }